

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dunk.c
# Opt level: O0

void envy_bios_print_inputdev(envy_bios *bios,FILE *out,uint mask)

{
  byte bVar1;
  envy_bios_inputdev *peVar2;
  envy_bios_inputdev_entry *peVar3;
  char *pcVar4;
  char *pcVar5;
  envy_bios_inputdev_entry *entry;
  int i;
  envy_bios_inputdev *inputdev;
  uint mask_local;
  FILE *out_local;
  envy_bios *bios_local;
  
  peVar2 = &bios->inputdev;
  if ((peVar2->offset != 0) && ((mask & 0x400000) != 0)) {
    if ((bios->inputdev).valid == '\0') {
      fprintf((FILE *)out,"Failed to parse INPUTDEV table at 0x%04x version %d.%d\n\n",
              (ulong)peVar2->offset,(ulong)(uint)((int)(uint)(bios->inputdev).version >> 4),
              (ulong)((bios->inputdev).version & 0xf));
    }
    else {
      fprintf((FILE *)out,"INPUTDEV table at 0x%04x version %d.%d\n",(ulong)peVar2->offset,
              (ulong)(uint)((int)(uint)(bios->inputdev).version >> 4),
              (ulong)((bios->inputdev).version & 0xf));
      envy_bios_dump_hex(bios,out,(uint)peVar2->offset,(uint)(bios->inputdev).hlen,mask);
      for (entry._4_4_ = 0; (int)entry._4_4_ < (int)(uint)(bios->inputdev).entriesnum;
          entry._4_4_ = entry._4_4_ + 1) {
        peVar3 = (bios->inputdev).entries + (int)entry._4_4_;
        if (((peVar3->entry & 0xf) != 0xf) || ((mask & 0x40000000) != 0)) {
          bVar1 = peVar3->entry;
          pcVar4 = dump_inputdev_type((int)(uint)peVar3->entry >> 4 & 3);
          pcVar5 = dump_inputdev_vtype((int)(uint)peVar3->entry >> 6);
          fprintf((FILE *)out,"INPUTDEV %d: mode: %x, type: %s, vtype: %s\n",(ulong)entry._4_4_,
                  (ulong)(bVar1 & 0xf),pcVar4,pcVar5);
        }
        envy_bios_dump_hex(bios,out,(uint)peVar3->offset,(uint)(bios->inputdev).rlen,mask);
      }
      fprintf((FILE *)out,"\n");
    }
  }
  return;
}

Assistant:

void envy_bios_print_inputdev (struct envy_bios *bios, FILE *out, unsigned mask) {
	struct envy_bios_inputdev *inputdev = &bios->inputdev;
	if (!inputdev->offset || !(mask & ENVY_BIOS_PRINT_DUNK))
		return;
	if (!inputdev->valid) {
		fprintf(out, "Failed to parse INPUTDEV table at 0x%04x version %d.%d\n\n", inputdev->offset, inputdev->version >> 4, inputdev->version & 0xf);
		return;
	}
	fprintf(out, "INPUTDEV table at 0x%04x version %d.%d\n", inputdev->offset, inputdev->version >> 4, inputdev->version & 0xf);
	envy_bios_dump_hex(bios, out, inputdev->offset, inputdev->hlen, mask);
	int i;
	for (i = 0; i < inputdev->entriesnum; i++) {
		struct envy_bios_inputdev_entry *entry = &inputdev->entries[i];
		if ((entry->entry & 0xf) != 0x0f || (mask & ENVY_BIOS_PRINT_UNUSED)) {
			fprintf(out, "INPUTDEV %d: mode: %x, type: %s, vtype: %s\n", i,
				entry->entry & 0xf,
				dump_inputdev_type((entry->entry >> 4) & 3),
				dump_inputdev_vtype((entry->entry >> 6) & 3));
		}
		envy_bios_dump_hex(bios, out, entry->offset, inputdev->rlen, mask);
	}
	fprintf(out, "\n");
}